

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas2.cxx
# Opt level: O0

void HBLAS2::hblas2_gemv_square_LDSame<std::complex<double>,double,(char)78>(void)

{
  complex<double> ALPHA_00;
  bool bVar1;
  quaternion<double> *__y;
  quaternion<double> *__y_00;
  ostream *poVar2;
  quaternion<double> *pqVar3;
  void *this;
  reference pvVar4;
  reference __q;
  reference __x;
  result_type_conflict1 in_XMM0_Qa;
  quaternion<double> *__x_00;
  quaternion<double> *in_XMM1_Qa;
  quaternion<double> tmp;
  int32_t AStride;
  int32_t ACOL;
  int32_t AROW;
  int i;
  stringstream ss;
  double BETA;
  complex<double> ALPHA;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> YC;
  quaternion<double> *x_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2_2;
  quaternion<double> *x_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2_1;
  quaternion<double> *x;
  iterator __end2;
  iterator __begin2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> Y;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> X;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> A;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_fffffffffffff9a8;
  undefined4 uVar5;
  undefined1 pv_;
  quaternion<double> *__y_01;
  uniform_real_distribution<double> *in_stack_fffffffffffff9b0;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffff9bc;
  allocator_type *in_stack_fffffffffffff9c0;
  double in_stack_fffffffffffff9c8;
  quaternion<double> *in_stack_fffffffffffff9d0;
  undefined8 in_stack_fffffffffffff9d8;
  undefined8 uVar7;
  quaternion<double> *in_stack_fffffffffffff9e0;
  int32_t in_stack_fffffffffffff9ec;
  size_type __n;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffff9f8;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffffa00;
  int32_t INCX;
  int32_t INCY;
  basic_cstring<const_char> local_528;
  basic_cstring<const_char> local_518;
  undefined1 local_508 [32];
  undefined8 local_4e8;
  undefined1 local_420 [24];
  undefined1 local_408 [16];
  basic_cstring<const_char> local_3f8;
  double local_3e8;
  double local_3e0;
  double local_3d8;
  double local_3d0;
  double local_3c8;
  double local_3c0;
  double local_3b8;
  double local_3b0;
  quaternion<double> local_3a8;
  undefined4 local_388;
  int32_t iVar8;
  int iVar9;
  int iVar10;
  result_type_conflict1 rVar11;
  string local_368 [4];
  int32_t in_stack_fffffffffffffc9c;
  stringstream local_348 [16];
  ostream local_338 [376];
  quaternion<double> *local_1c0;
  result_type_conflict1 local_1b8;
  quaternion<double> *pqStack_1b0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_1a8;
  result_type_conflict1 local_190;
  result_type_conflict1 local_188;
  result_type_conflict1 local_180;
  result_type_conflict1 local_178;
  quaternion<double> local_170;
  reference local_150;
  quaternion<double> *local_148;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_140;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_138;
  result_type_conflict1 local_130;
  result_type_conflict1 local_128;
  result_type_conflict1 local_120;
  result_type_conflict1 local_118;
  quaternion<double> local_110;
  reference local_f0;
  quaternion<double> *local_e8;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_e0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_d8;
  result_type_conflict1 local_d0;
  result_type_conflict1 local_c8;
  result_type_conflict1 local_c0;
  result_type_conflict1 local_b8;
  quaternion<double> local_b0;
  reference local_90;
  quaternion<double> *local_88;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_80;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_78;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_68;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_48 [2];
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_18;
  
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1e25fc);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9d0,(size_type)in_stack_fffffffffffff9c8,
             in_stack_fffffffffffff9c0);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1e2625);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1e263a);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9d0,(size_type)in_stack_fffffffffffff9c8,
             in_stack_fffffffffffff9c0);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1e2663);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1e2678);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9d0,(size_type)in_stack_fffffffffffff9c8,
             in_stack_fffffffffffff9c0);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1e26a1);
  local_78 = local_48;
  local_80._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
                  in_stack_fffffffffffff9a8);
  local_88 = (quaternion<double> *)
             std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                       ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                         *)in_stack_fffffffffffff9a8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff9b0,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff9a8);
    if (!bVar1) break;
    local_90 = __gnu_cxx::
               __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
               ::operator*(&local_80);
    local_b8 = std::uniform_real_distribution<double>::operator()
                         (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    local_c0 = std::uniform_real_distribution<double>::operator()
                         (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    local_c8 = std::uniform_real_distribution<double>::operator()
                         (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    in_XMM0_Qa = std::uniform_real_distribution<double>::operator()
                           (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    local_d0 = in_XMM0_Qa;
    HAXX::quaternion<double>::quaternion(&local_b0,&local_b8,&local_c0,&local_c8,&local_d0);
    local_90->_M_real = local_b0._M_real;
    local_90->_M_imag_i = local_b0._M_imag_i;
    local_90->_M_imag_j = local_b0._M_imag_j;
    local_90->_M_imag_k = local_b0._M_imag_k;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_80);
  }
  local_d8 = &local_68;
  local_e0._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
                  in_stack_fffffffffffff9a8);
  local_e8 = (quaternion<double> *)
             std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                       ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                         *)in_stack_fffffffffffff9a8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff9b0,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff9a8);
    if (!bVar1) break;
    local_f0 = __gnu_cxx::
               __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
               ::operator*(&local_e0);
    local_118 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    local_120 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    local_128 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    in_XMM0_Qa = std::uniform_real_distribution<double>::operator()
                           (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    local_130 = in_XMM0_Qa;
    HAXX::quaternion<double>::quaternion(&local_110,&local_118,&local_120,&local_128,&local_130);
    local_f0->_M_real = local_110._M_real;
    local_f0->_M_imag_i = local_110._M_imag_i;
    local_f0->_M_imag_j = local_110._M_imag_j;
    local_f0->_M_imag_k = local_110._M_imag_k;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_e0);
  }
  local_138 = &local_18;
  local_140._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
                  in_stack_fffffffffffff9a8);
  local_148 = (quaternion<double> *)
              std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                        ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          *)in_stack_fffffffffffff9a8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff9b0,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff9a8);
    iVar8 = (int32_t)((ulong)in_stack_fffffffffffff9d8 >> 0x20);
    if (!bVar1) break;
    local_150 = __gnu_cxx::
                __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                ::operator*(&local_140);
    local_178 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    local_180 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    local_188 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    in_XMM0_Qa = std::uniform_real_distribution<double>::operator()
                           (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    local_190 = in_XMM0_Qa;
    HAXX::quaternion<double>::quaternion(&local_170,&local_178,&local_180,&local_188,&local_190);
    local_150->_M_real = local_170._M_real;
    local_150->_M_imag_i = local_170._M_imag_i;
    local_150->_M_imag_j = local_170._M_imag_j;
    local_150->_M_imag_k = local_170._M_imag_k;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_140);
  }
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  uVar5 = (undefined4)((ulong)in_stack_fffffffffffff9a8 >> 0x20);
  genRandom<std::complex<double>>();
  local_1b8 = in_XMM0_Qa;
  pqStack_1b0 = in_XMM1_Qa;
  __x_00 = (quaternion<double> *)genRandom<double>();
  local_1c0 = __x_00;
  std::__cxx11::stringstream::stringstream(local_348);
  __y = (quaternion<double> *)std::operator<<(local_338,"hblas2_gemv_square_");
  std::operator<<((ostream *)__y,'N');
  std::operator<<(local_338,"C");
  std::operator<<(local_338,"R");
  std::operator<<(local_338,"_LDSame");
  std::__cxx11::stringstream::str();
  __y_00 = (quaternion<double> *)std::operator<<((ostream *)&std::cout,local_368);
  poVar2 = std::operator<<((ostream *)__y_00," will use");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  INCY = (int32_t)poVar2;
  std::__cxx11::string::~string(local_368);
  pqVar3 = (quaternion<double> *)std::operator<<((ostream *)&std::cout,"  ALPHA = ");
  poVar2 = std::operator<<((ostream *)pqVar3,(complex *)&local_1b8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  INCX = (int32_t)poVar2;
  poVar2 = std::operator<<((ostream *)&std::cout,"  BETA = ");
  this = (void *)std::ostream::operator<<(poVar2,(double)local_1c0);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  __n = 0;
  rVar11 = local_1b8;
  pvVar4 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
           operator[](&local_18,0);
  __q = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
        operator[](local_48,__n);
  __x = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
        operator[](&local_68,__n);
  uVar6 = 1;
  __y_01 = (quaternion<double> *)CONCAT44(uVar5,1);
  ALPHA_00._M_value._8_8_ = __q;
  ALPHA_00._M_value._0_8_ = pvVar4;
  HAXX::
  HBLAS_GEMV<double,HAXX::quaternion<double>,HAXX::quaternion<double>,std::complex<double>,double>
            ((char)(__n >> 0x38),(int32_t)__n,in_stack_fffffffffffff9ec,ALPHA_00,
             in_stack_fffffffffffff9e0,iVar8,in_stack_fffffffffffff9d0,INCX,
             in_stack_fffffffffffff9c8,pqVar3,INCY);
  iVar9 = 0;
  pqVar3 = pqStack_1b0;
  while (iVar9 < 100) {
    iVar8 = 0;
    local_388 = 100;
    local_3b0 = 0.0;
    local_3b8 = 0.0;
    local_3c0 = 0.0;
    local_3c8 = 0.0;
    iVar10 = iVar9;
    HAXX::quaternion<double>::quaternion(&local_3a8,&local_3b0,&local_3b8,&local_3c0,&local_3c8);
    std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
              (&local_18,(long)(iVar9 + iVar8 * 100));
    std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
              (local_48,0);
    HAXX::HBLAS_DOTUV<double>
              (in_stack_fffffffffffffc9c,pqVar3,(int32_t)((ulong)rVar11 >> 0x20),
               (quaternion<double> *)CONCAT44(iVar10,iVar9),iVar8);
    local_3a8._M_real = local_3e8;
    local_3a8._M_imag_i = local_3e0;
    local_3a8._M_imag_j = local_3d8;
    local_3a8._M_imag_k = local_3d0;
    do {
      uVar7 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_3f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx"
                 ,0x58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)__x);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar7,&local_3f8,0x47,local_408);
      HAXX::operator*((complex<double> *)__y,__y_00);
      std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
                (&local_1a8,(long)iVar10);
      HAXX::operator*(&__x->_M_real,__y_01);
      HAXX::operator+(__x,__y_01);
      std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
                (&local_68,(long)iVar10);
      HAXX::inv<double>(__q);
      HAXX::operator*(__x_00,__y);
      local_4e8 = 0x3ff0000000000000;
      HAXX::operator-(__x,&__y_01->_M_real);
      pv_ = (undefined1)((ulong)__y_01 >> 0x38);
      in_stack_fffffffffffff9d0 =
           (quaternion<double> *)HAXX::norm<double>(in_stack_fffffffffffff9d0);
      boost::test_tools::assertion_result::assertion_result((assertion_result *)__x,(bool)pv_);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_518,
                 "( HAXX::norm(((ALPHA*tmp + BETA*YC[i]) * HAXX::inv(Y[i]))- 1.) < 1e-12 )",0x48);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff9bc,uVar6),
                 (basic_cstring<const_char> *)__x);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_528,
                 "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx"
                 ,0x58);
      __y_01 = (quaternion<double> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_420,local_508,&local_528,0x47,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1e3257);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1e3264);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    iVar9 = iVar10 + 1;
  }
  std::__cxx11::stringstream::~stringstream(local_348);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9c0);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9c0);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9c0);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9c0);
  return;
}

Assistant:

void hblas2_gemv_square_LDSame() {

  // Random Quaternion vectors and matricies
  std::vector<HAXX::quaternion<double>> 
    A(HBLAS2_MATLEN), X(HBLAS1_VECLEN), Y(HBLAS1_VECLEN);

  for(auto &x : X) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : Y) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : A) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));

  std::vector<HAXX::quaternion<double>> YC(Y);

  _AlphaF ALPHA = genRandom<_AlphaF>();
  _BetaF  BETA = genRandom<_BetaF>();

  std::stringstream ss;

  ss << "hblas2_gemv_square_" << _TA;
  if(std::is_same<double,_AlphaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_AlphaF>::value) ss << "C";
  else ss << "Q";
  if(std::is_same<double,_BetaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_BetaF>::value) ss << "C";
  else ss << "Q";
  ss << "_LDSame";

  std::cout << ss.str() << " will use" << std::endl;
  std::cout << "  ALPHA = " << ALPHA << std::endl;
  std::cout << "  BETA = " << BETA << std::endl;

  HBLAS_GEMV(_TA,HBLAS1_VECLEN,HBLAS1_VECLEN,ALPHA,&A[0],HBLAS1_VECLEN,&X[0],1,
    BETA,&Y[0],1);

  for(int i = 0; i < HBLAS1_VECLEN; i++) {
    HAXX_INT AROW = 0;
    HAXX_INT ACOL = i;
    HAXX_INT AStride = 1;
    if( _TA == 'N' ) {
      AROW = i;
      ACOL = 0;
      AStride = HBLAS1_VECLEN;
    }

    HAXX::quaternion<double> tmp;
    if( _TA == 'C' )
      tmp = HBLAS_DOTCV(HBLAS1_VECLEN,&A[RANK2_INDX(AROW,ACOL,HBLAS1_VECLEN)],
          AStride,&X[0],1);
    else
      tmp = HBLAS_DOTUV(HBLAS1_VECLEN,&A[RANK2_INDX(AROW,ACOL,HBLAS1_VECLEN)],
          AStride,&X[0],1);

    BOOST_CHECK(CMP_Q(ALPHA*tmp + BETA*YC[i],Y[i]));
  }

}